

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

void get_top_weights<dense_parameters>
               (vw *all,int top_words_count,int topic,
               vector<feature,_std::allocator<feature>_> *output,dense_parameters *weights)

{
  undefined8 *puVar1;
  float fVar2;
  uint64_t uVar3;
  ulong uVar4;
  weight *pwVar5;
  long lVar6;
  pointer pfVar7;
  long lVar8;
  pointer pfVar9;
  undefined1 *puVar10;
  pointer pfVar11;
  int iVar12;
  float *pfVar13;
  anon_class_1_0_00000001 cmp;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  top_features;
  anon_class_1_0_00000001 local_91;
  vector<feature,_std::allocator<feature>_> *local_90;
  vector<feature,_std::allocator<feature>_> local_88;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  local_70;
  long local_50;
  weight *local_48;
  ulong local_40;
  pointer local_38;
  
  pfVar7 = (pointer)(1L << ((byte)all->num_bits & 0x3f));
  local_88.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
  ::priority_queue(&local_70,&local_91,&local_88);
  if (local_88.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar4 = 1L << ((byte)weights->_stride_shift & 0x3f);
  pwVar5 = weights->_begin;
  pfVar11 = (pointer)(long)top_words_count;
  lVar6 = (long)topic;
  if (top_words_count != 0) {
    pfVar9 = pfVar7;
    if (pfVar11 < pfVar7) {
      pfVar9 = pfVar11;
    }
    puVar10 = (undefined1 *)((long)&pfVar9->x + (ulong)(pfVar9 == (pointer)0x0));
    lVar8 = 0;
    local_90 = output;
    local_50 = lVar6;
    local_48 = pwVar5;
    local_40 = uVar4;
    local_38 = pfVar7;
    do {
      local_88.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)(lVar8 >> 2);
      local_88.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)CONCAT44(local_88.super__Vector_base<feature,_std::allocator<feature>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    *(undefined4 *)((long)pwVar5 + lVar8 + lVar6 * 4));
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
      ::push(&local_70,(value_type *)&local_88);
      lVar8 = lVar8 + uVar4 * 4;
      puVar10 = puVar10 + -1;
    } while (puVar10 != (undefined1 *)0x0);
    pwVar5 = (weight *)((long)local_48 + lVar8);
    uVar4 = local_40;
    lVar6 = local_50;
    pfVar7 = local_38;
    output = local_90;
  }
  if (pfVar11 < pfVar7) {
    pfVar13 = pwVar5 + lVar6;
    do {
      fVar2 = *pfVar13;
      local_90 = (vector<feature,_std::allocator<feature>_> *)CONCAT44(local_90._4_4_,fVar2);
      if ((local_70.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
           super__Vector_impl_data._M_start)->x <= fVar2 &&
          fVar2 != (local_70.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                    super__Vector_impl_data._M_start)->x) {
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
        ::pop(&local_70);
        local_88.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_88.super__Vector_base<feature,_std::allocator<feature>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,local_90._0_4_);
        local_88.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
        super__Vector_impl_data._M_finish = pfVar11;
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
        ::push(&local_70,(value_type *)&local_88);
      }
      pfVar11 = (pointer)((long)&pfVar11->x + 1);
      pfVar13 = pfVar13 + (uVar4 & 0xffffffff);
    } while (pfVar7 != pfVar11);
  }
  std::vector<feature,_std::allocator<feature>_>::resize
            (output,(long)local_70.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_70.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                          super__Vector_impl_data._M_start >> 4);
  iVar12 = (int)((ulong)((long)local_70.c.super__Vector_base<feature,_std::allocator<feature>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_70.c.super__Vector_base<feature,_std::allocator<feature>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 4) + 1;
  uVar4 = (long)local_70.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_70.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                super__Vector_impl_data._M_start & 0xffffffff0;
  while( true ) {
    iVar12 = iVar12 + -1;
    if (iVar12 < 1) break;
    uVar3 = (local_70.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
             super__Vector_impl_data._M_start)->weight_index;
    puVar1 = (undefined8 *)
             ((long)&(output->super__Vector_base<feature,_std::allocator<feature>_>)._M_impl.
                     super__Vector_impl_data._M_start[-1].x + uVar4);
    *puVar1 = *(undefined8 *)
               local_70.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
               super__Vector_impl_data._M_start;
    puVar1[1] = uVar3;
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
    ::pop(&local_70);
    uVar4 = uVar4 - 0x10;
  }
  if (local_70.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void get_top_weights(vw *all, int top_words_count, int topic, std::vector<feature> &output, T &weights)
{
  uint64_t length = (uint64_t)1 << all->num_bits;

  // get top features for this topic
  auto cmp = [](feature left, feature right) { return left.x > right.x; };
  std::priority_queue<feature, std::vector<feature>, decltype(cmp)> top_features(cmp);
  typename T::iterator iter = weights.begin();

  for (uint64_t i = 0; i < min(top_words_count, length); i++, ++iter)
    top_features.push({(&(*iter))[topic], iter.index()});

  for (uint64_t i = top_words_count; i < length; i++, ++iter)
  {
    weight v = (&(*iter))[topic];
    if (v > top_features.top().x)
    {
      top_features.pop();
      top_features.push({v, i});
    }
  }

  // extract idx and sort descending
  output.resize(top_features.size());
  for (int i = (int)top_features.size() - 1; i >= 0; i--)
  {
    output[i] = top_features.top();
    top_features.pop();
  }
}